

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrecursive_maximum_likelihood_parameter_generation.cc
# Opt level: O1

bool __thiscall
sptk::NonrecursiveMaximumLikelihoodParameterGeneration::Run
          (NonrecursiveMaximumLikelihoodParameterGeneration *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *mean_vectors,
          vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *covariance_matrices
          ,vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *smoothed_static_parameters)

{
  _Vector_impl_data *p_Var1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *pvVar2;
  pointer pSVar3;
  byte bVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  pointer pvVar10;
  ulong *puVar11;
  long lVar12;
  double *pdVar13;
  int *piVar14;
  pointer *ppdVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  pointer pdVar23;
  int iVar24;
  int iVar25;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *pvVar26;
  long lVar27;
  pointer pvVar28;
  double *pdVar29;
  uint uVar30;
  long lVar31;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *pvVar32;
  int column;
  size_type __n;
  size_type __n_00;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *pvVar33;
  ulong uVar34;
  uint uVar35;
  bool bVar36;
  double dVar37;
  double dVar38;
  int outer_size;
  vector<bool,_std::allocator<bool>_> is_continuous;
  SymmetricMatrix precision;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  wuw;
  vector<double,_std::allocator<double>_> wum;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> vseq;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  mseq;
  vector<double,_std::allocator<double>_> cc;
  vector<double,_std::allocator<double>_> gg;
  double local_240;
  ulong local_238;
  long local_230;
  long local_200;
  uint local_1ec;
  Row local_1e8;
  size_type local_1d0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_1c8;
  ulong local_1c0;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *local_1b8;
  long local_1b0;
  long local_1a8;
  ulong local_1a0;
  ulong local_198;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *local_190;
  ulong local_188;
  ulong local_180;
  vector<bool,_std::allocator<bool>_> local_178;
  undefined1 local_150 [16];
  int local_140;
  ulong local_110;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_108;
  ulong local_100;
  long local_f8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_f0;
  vector<double,_std::allocator<double>_> local_d8;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> local_c0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_a8;
  ulong local_90;
  ulong local_88;
  long local_80;
  long local_78;
  long local_70;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_68;
  vector<double,_std::allocator<double>_> local_60;
  vector<double,_std::allocator<double>_> local_48;
  
  if (this->is_valid_ == true) {
    pvVar10 = (mean_vectors->
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pvVar28 = (mean_vectors->
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (pvVar10 != pvVar28) {
      if (smoothed_static_parameters ==
          (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *)0x0) {
        return false;
      }
      lVar21 = ((long)pvVar28 - (long)pvVar10 >> 3) * -0x5555555555555555;
      pSVar3 = (covariance_matrices->
               super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar9 = (long)(covariance_matrices->
                    super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3;
      if (lVar21 - ((long)uVar9 >> 6) != 0) {
        return false;
      }
      local_100 = ((long)(this->window_coefficients_).
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->window_coefficients_).
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      local_110 = (ulong)(uint)this->num_order_;
      uVar30 = this->num_order_ + 1;
      uVar18 = uVar30 * (int)local_100;
      uVar20 = (uint)lVar21;
      bVar36 = (int)uVar20 < 1;
      if (0 < (int)uVar20) {
        if (uVar18 != (uint)((ulong)((long)(pvVar10->
                                           super__Vector_base<double,_std::allocator<double>_>).
                                           _M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pvVar10->
                                          super__Vector_base<double,_std::allocator<double>_>).
                                          _M_impl.super__Vector_impl_data._M_start) >> 3)) {
          return false;
        }
        ppdVar15 = &pvVar10[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        uVar22 = 1;
        do {
          uVar16 = uVar22;
          if ((uVar20 & 0x7fffffff) == uVar16) break;
          pdVar23 = *ppdVar15;
          p_Var1 = (_Vector_impl_data *)(ppdVar15 + -1);
          ppdVar15 = ppdVar15 + 3;
          uVar22 = uVar16 + 1;
        } while (uVar18 - (int)((ulong)((long)pdVar23 - (long)p_Var1->_M_start) >> 3) == 0);
        bVar36 = (uVar20 & 0x7fffffff) <= uVar16;
      }
      if (bVar36) {
        uVar6 = (uint)(uVar9 >> 6);
        bVar36 = (int)uVar6 < 1;
        if (0 < (int)uVar6) {
          if (pSVar3->num_dimension_ != uVar18) {
            return false;
          }
          piVar14 = &pSVar3[1].num_dimension_;
          uVar9 = 1;
          do {
            uVar22 = uVar9;
            if ((uVar6 & 0x7fffffff) == uVar22) break;
            uVar35 = *piVar14;
            piVar14 = piVar14 + 0x10;
            uVar9 = uVar22 + 1;
          } while (uVar35 == uVar18);
          bVar36 = (uVar6 & 0x7fffffff) <= uVar22;
        }
        if (bVar36) {
          __n_00 = (size_type)(int)uVar20;
          local_150[0] = 1;
          local_1c8 = mean_vectors;
          local_108 = smoothed_static_parameters;
          std::vector<bool,_std::allocator<bool>_>::vector
                    (&local_178,__n_00,(bool *)local_150,(allocator_type *)&local_a8);
          if ((0 < (int)uVar20) && (this->use_magic_number_ != false)) {
            dVar37 = this->magic_number_;
            pvVar10 = (local_1c8->
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            uVar9 = 0;
            do {
              pdVar13 = (pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              if ((dVar37 == *pdVar13) && (!NAN(dVar37) && !NAN(*pdVar13))) {
                bVar4 = (byte)uVar9 & 0x3f;
                local_178.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar9 >> 6] =
                     local_178.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar9 >> 6] &
                     (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
              }
              uVar9 = uVar9 + 1;
              pvVar10 = pvVar10 + 1;
            } while ((uVar20 & 0x7fffffff) != uVar9);
          }
          uVar9 = 0;
          if (local_178.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_offset != 0 ||
              local_178.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p !=
              local_178.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_p) {
            uVar22 = 0;
            puVar11 = local_178.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            do {
              uVar9 = uVar9 + ((*puVar11 >> (uVar22 & 0x3f) & 1) != 0);
              iVar7 = (int)uVar22;
              puVar11 = puVar11 + (iVar7 == 0x3f);
              uVar22 = (ulong)(iVar7 + 1);
              if (iVar7 == 0x3f) {
                uVar22 = 0;
              }
            } while ((uint)uVar22 !=
                     local_178.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset ||
                     puVar11 !=
                     local_178.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p);
          }
          local_180 = (ulong)(uint)this->max_half_window_width_;
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)local_150,(long)(int)uVar18,
                     (allocator_type *)&local_c0);
          uVar6 = (uint)uVar9;
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::vector(&local_a8,(long)(int)uVar6,(value_type *)local_150,(allocator_type *)&local_d8);
          if ((_func_int **)local_150._0_8_ != (_func_int **)0x0) {
            operator_delete((void *)local_150._0_8_);
          }
          SymmetricMatrix::SymmetricMatrix((SymmetricMatrix *)local_150,uVar18);
          local_1b8 = covariance_matrices;
          std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::vector
                    (&local_c0,(long)(int)uVar6,(value_type *)local_150,(allocator_type *)&local_d8)
          ;
          uVar35 = uVar30 * uVar6;
          SymmetricMatrix::~SymmetricMatrix((SymmetricMatrix *)local_150);
          __n = (size_type)(int)uVar35;
          std::vector<double,_std::allocator<double>_>::vector
                    (&local_d8,__n,(allocator_type *)local_150);
          iVar7 = ((int)local_180 * 2 + 1) * uVar30;
          local_1d0 = (size_type)iVar7;
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)local_150,local_1d0,
                     (allocator_type *)&local_48);
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::vector(&local_f0,__n,(value_type *)local_150,(allocator_type *)&local_60);
          if ((_func_int **)local_150._0_8_ != (_func_int **)0x0) {
            operator_delete((void *)local_150._0_8_);
          }
          std::vector<double,_std::allocator<double>_>::vector
                    (&local_48,__n,(allocator_type *)local_150);
          std::vector<double,_std::allocator<double>_>::vector
                    (&local_60,__n,(allocator_type *)local_150);
          pvVar26 = local_108;
          if (((long)(local_108->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(local_108->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - __n_00
              != 0) {
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::resize(local_108,__n_00);
          }
          if (0 < (int)uVar20) {
            uVar22 = (ulong)(uVar20 & 0x7fffffff);
            lVar21 = 0;
            do {
              pvVar10 = (pvVar26->
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              if (*(long *)((long)&(pvVar10->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data + lVar21 + 8) -
                  *(long *)((long)&(pvVar10->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data + lVar21) >> 3 !=
                  (long)(int)uVar30) {
                std::vector<double,_std::allocator<double>_>::resize
                          ((vector<double,_std::allocator<double>_> *)
                           ((long)&(pvVar10->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data + lVar21),(long)(int)uVar30);
              }
              lVar21 = lVar21 + 0x18;
              uVar22 = uVar22 - 1;
            } while (uVar22 != 0);
          }
          bVar36 = (int)uVar20 < 1;
          if (0 < (int)uVar20) {
            uVar22 = (ulong)(uVar20 & 0x7fffffff);
            iVar8 = 0;
            uVar16 = 0;
            local_1c0 = local_1c0 & 0xffffffff00000000;
            local_188 = uVar22;
            do {
              if ((local_178.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar16 >> 6] >>
                   (uVar16 & 0x3f) & 1) != 0) {
                SymmetricMatrix::SymmetricMatrix((SymmetricMatrix *)local_150,0);
                bVar5 = SymmetricMatrix::Invert
                                  ((local_1b8->
                                   super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                                   )._M_impl.super__Vector_impl_data._M_start + uVar16,
                                   (SymmetricMatrix *)local_150);
                local_1b0 = CONCAT71(local_1b0._1_7_,bVar5);
                if (bVar5) {
                  if (0 < (int)uVar18) {
                    lVar21 = *(long *)&(local_1c8->
                                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start[uVar16].
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data;
                    lVar12 = (long)(int)local_1c0;
                    uVar22 = 0;
                    local_1a8 = lVar12;
                    do {
                      column = (int)uVar22;
                      iVar25 = (int)((long)((ulong)(uint)(column >> 0x1f) << 0x20 |
                                           uVar22 & 0xffffffff) / (long)(int)uVar30);
                      pvVar10 = (this->window_coefficients_).
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      lVar17 = *(long *)&pvVar10[iVar25].
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data;
                      iVar25 = (int)((ulong)((long)*(pointer *)
                                                    ((long)&pvVar10[iVar25].
                                                                                                                        
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data + 8) - lVar17) >>
                                    3);
                      if (iVar25 < 0) {
LAB_00114dbb:
                        local_1e8._vptr_Row = (_func_int **)&PTR__Row_0011fac0;
                        local_1e8.matrix_ = (SymmetricMatrix *)local_150;
                        local_1e8.row_ = column;
                        pdVar13 = SymmetricMatrix::Row::operator[](&local_1e8,column);
                        lVar17 = local_1a8;
                        dVar37 = *pdVar13;
                        local_a8.
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar12].
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar22] =
                             *(double *)(lVar21 + uVar22 * 8) * dVar37;
                        local_1e8.matrix_ =
                             local_c0.
                             super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                             ._M_impl.super__Vector_impl_data._M_start + local_1a8;
                        local_1e8._vptr_Row = (_func_int **)&PTR__Row_0011fac0;
                        local_1e8.row_ = column;
                        pdVar13 = SymmetricMatrix::Row::operator[](&local_1e8,column);
                        *pdVar13 = dVar37;
                        if (uVar22 != 0) {
                          uVar19 = 0;
                          do {
                            local_1e8._vptr_Row = (_func_int **)&PTR__Row_0011fac0;
                            local_1e8.matrix_ = (SymmetricMatrix *)local_150;
                            local_1e8.row_ = column;
                            pdVar13 = SymmetricMatrix::Row::operator[](&local_1e8,(int)uVar19);
                            dVar37 = *pdVar13;
                            if ((dVar37 != 0.0) || (NAN(dVar37))) {
                              pdVar23 = local_a8.
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[lVar12].
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start;
                              pdVar23[uVar22] =
                                   *(double *)(lVar21 + uVar19 * 8) * dVar37 + pdVar23[uVar22];
                              pdVar23[uVar19] =
                                   *(double *)(lVar21 + uVar22 * 8) * dVar37 + pdVar23[uVar19];
                              local_1e8.matrix_ =
                                   local_c0.
                                   super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar17;
                              local_1e8._vptr_Row = (_func_int **)&PTR__Row_0011fac0;
                              local_1e8.row_ = column;
                              pdVar13 = SymmetricMatrix::Row::operator[](&local_1e8,(int)uVar19);
                              *pdVar13 = dVar37;
                            }
                            uVar19 = uVar19 + 1;
                          } while (uVar22 != uVar19);
                        }
                      }
                      else {
                        iVar24 = (iVar25 - (iVar25 + -1 >> 0x1f)) + -1 >> 1;
                        iVar25 = -iVar24;
                        if (iVar24 != iVar25 && SBORROW4(iVar24,iVar25) == iVar24 * 2 < 0) {
                          iVar25 = iVar24;
                        }
                        lVar27 = 0;
                        bVar5 = false;
                        do {
                          lVar31 = (local_1a8 - iVar24) + lVar27;
                          if (((lVar31 < 0) || ((int)uVar6 <= lVar31)) ||
                             (((dVar37 = *(double *)(lVar17 + lVar27 * 8), dVar37 != 0.0 ||
                               (NAN(dVar37))) &&
                              (((uint)((iVar8 - iVar24) + (int)lVar27) < uVar20 &&
                               (uVar19 = (uVar16 - (long)iVar24) + lVar27,
                               (local_178.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                [uVar19 >> 6] >> (uVar19 & 0x3f) & 1) == 0)))))) {
                            bVar5 = true;
                          }
                          lVar27 = lVar27 + 1;
                        } while (iVar25 + iVar24 + 1 != (int)lVar27);
                        if (!bVar5) goto LAB_00114dbb;
                      }
                      uVar22 = uVar22 + 1;
                    } while (uVar22 != uVar18);
                  }
                  local_1c0 = CONCAT44(local_1c0._4_4_,(int)local_1c0 + 1);
                  uVar22 = local_188;
                }
                SymmetricMatrix::~SymmetricMatrix((SymmetricMatrix *)local_150);
                if ((char)local_1b0 == '\0') goto LAB_0011576e;
              }
              uVar16 = uVar16 + 1;
              bVar36 = uVar22 <= uVar16;
              iVar8 = iVar8 + 1;
            } while (uVar16 != uVar22);
          }
          uVar18 = (int)local_180 * 2;
          local_1a0 = (ulong)uVar18;
          if (0 < (int)uVar6) {
            pvVar26 = (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)(uVar9 & 0x7fffffff);
            local_70 = (long)(int)uVar18;
            local_198 = (ulong)uVar30;
            local_1b8 = (vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
                        (local_100 & 0x7fffffff);
            uVar9 = 1;
            pvVar32 = (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)0x0;
            local_68 = pvVar26;
            do {
              if (-1 < (int)local_110) {
                local_90 = (ulong)(uVar30 * (int)pvVar32);
                uVar16 = 0;
                uVar22 = 0;
                local_1c8 = pvVar32;
                local_188 = uVar9;
                do {
                  local_f8 = local_90 + uVar22;
                  local_1ec = (uint)uVar16;
                  local_238 = 0;
                  local_1c0 = uVar22;
                  local_88 = uVar16;
                  do {
                    if (0 < (int)local_100) {
                      local_190 = (vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                                   *)0x0;
                      do {
                        local_230 = (long)this->max_half_window_width_;
                        if (-1 < local_230) {
                          pvVar10 = (this->window_coefficients_).
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          local_200 = *(long *)&pvVar10[(long)local_190].
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data;
                          iVar8 = (int)((ulong)((long)*(pointer *)
                                                       ((long)&pvVar10[(long)local_190].
                                                                                                                              
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data + 8) - local_200)
                                       >> 3);
                          iVar8 = (iVar8 - (iVar8 + -1 >> 0x1f)) + -1 >> 1;
                          local_1b0 = (long)iVar8;
                          local_78 = local_200 + local_1b0 * 8;
                          local_1a8 = CONCAT44(local_1a8._4_4_,
                                               (int)local_190 * (int)local_198 + (int)local_238);
                          lVar12 = (long)-iVar8;
                          local_200 = local_1b0 * 8 + local_230 * 8 + local_200;
                          local_80 = (long)local_190 * local_198 * 8;
                          lVar21 = -local_230;
                          do {
                            lVar17 = (long)&(pvVar32->
                                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + lVar21;
                            if ((uint)lVar17 < uVar6) {
                              if (((local_238 == 0) && (lVar12 <= lVar21)) && (lVar21 <= local_1b0))
                              {
                                pdVar13 = (double *)(local_78 + lVar21 * -8);
                                dVar37 = *pdVar13;
                                if ((dVar37 != 0.0) || (NAN(dVar37))) {
                                  local_d8.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start[local_f8] =
                                       *pdVar13 *
                                       *(double *)
                                        ((long)local_a8.
                                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[lVar17].
                                               super__Vector_base<double,_std::allocator<double>_>.
                                               _M_impl.super__Vector_impl_data._M_start +
                                        uVar22 * 8 + local_80) +
                                       local_d8.super__Vector_base<double,_std::allocator<double>_>.
                                       _M_impl.super__Vector_impl_data._M_start[local_f8];
                                }
                              }
                              local_240 = 0.0;
                              lVar27 = 8;
                              pvVar33 = local_1b8;
                              do {
                                local_150._8_8_ =
                                     local_c0.
                                     super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar17;
                                local_150._0_8_ = &PTR__Row_0011fac0;
                                local_140 = (int)uVar22;
                                pdVar13 = SymmetricMatrix::Row::operator[]
                                                    ((Row *)local_150,(int)local_1a8);
                                pvVar10 = (this->window_coefficients_).
                                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start;
                                lVar31 = *(long *)((long)pvVar10 + lVar27 + -8);
                                iVar8 = (int)((ulong)(*(long *)((long)&(pvVar10->
                                                                                                                                              
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  )._M_impl.super__Vector_impl_data + lVar27) -
                                                  lVar31) >> 3);
                                iVar8 = (iVar8 - (iVar8 + -1 >> 0x1f)) + -1 >> 1;
                                lVar31 = lVar31 + (long)iVar8 * 8;
                                bVar5 = false;
                                if ((-iVar8 <= lVar21) && (lVar21 <= iVar8)) {
                                  bVar5 = *(double *)(lVar31 + lVar21 * -8) != 0.0;
                                }
                                if (bVar5) {
                                  dVar37 = *pdVar13;
                                  if ((dVar37 != 0.0) || (NAN(dVar37))) {
                                    local_240 = local_240 +
                                                dVar37 * *(double *)(lVar31 + lVar21 * -8);
                                  }
                                }
                                uVar22 = (ulong)((int)uVar22 + uVar30);
                                lVar27 = lVar27 + 0x18;
                                pvVar33 = (vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                                           *)((long)&pvVar33[-1].
                                                                                                          
                                                  super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 7);
                              } while (pvVar33 !=
                                       (vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                                        *)0x0);
                              pvVar26 = local_68;
                              uVar9 = local_188;
                              pvVar32 = local_1c8;
                              uVar22 = local_1c0;
                              if (local_240 != 0.0 && -1 < (int)local_180) {
                                lVar17 = 0;
                                uVar18 = local_1ec;
                                do {
                                  bVar5 = false;
                                  if ((lVar12 <= local_230 + lVar17) &&
                                     (bVar5 = false, local_230 + lVar17 <= local_1b0)) {
                                    bVar5 = *(double *)(local_200 + lVar17 * 8) != 0.0;
                                  }
                                  if ((bVar5) && (-1 < (int)uVar18)) {
                                    pdVar23 = local_f0.
                                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[local_f8].
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start;
                                    pdVar23[uVar18] =
                                         *(double *)(local_200 + lVar17 * 8) * local_240 +
                                         pdVar23[uVar18];
                                  }
                                  if (local_70 <= lVar17) break;
                                  pvVar2 = (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                            *)(local_188 + lVar17);
                                  lVar17 = lVar17 + 1;
                                  uVar18 = uVar18 + uVar30;
                                } while (pvVar2 < local_68);
                              }
                            }
                            local_200 = local_200 + -8;
                            local_230 = local_230 + -1;
                            bVar5 = lVar21 < this->max_half_window_width_;
                            lVar21 = lVar21 + 1;
                          } while (bVar5);
                        }
                        local_190 = (vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                                     *)((long)&(local_190->
                                               super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                                               )._M_impl.super__Vector_impl_data._M_start + 1);
                      } while (local_190 != local_1b8);
                    }
                    local_238 = local_238 + 1;
                    local_1ec = local_1ec + 1;
                  } while (local_238 != local_198);
                  uVar22 = uVar22 + 1;
                  uVar16 = (ulong)((int)local_88 - 1);
                } while (uVar22 != local_198);
              }
              pvVar32 = (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)((long)&(pvVar32->
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start + 1);
              uVar9 = uVar9 + 1;
            } while (pvVar32 != pvVar26);
          }
          uVar9 = (ulong)uVar35;
          if (0 < (int)uVar35) {
            pvVar10 = local_f0.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + -1;
            uVar22 = 0;
            do {
              if (uVar22 != 0 && 1 < iVar7) {
                pdVar13 = local_f0.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar22].
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                dVar37 = *pdVar13;
                pvVar28 = pvVar10;
                uVar16 = 1;
                do {
                  pdVar29 = (pvVar28->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start;
                  dVar38 = pdVar29[uVar16];
                  dVar37 = dVar37 - dVar38 * dVar38 * *pdVar29;
                  *pdVar13 = dVar37;
                  if ((long)local_1d0 <= (long)(uVar16 + 1)) break;
                  pvVar28 = pvVar28 + -1;
                  bVar5 = uVar16 < uVar22;
                  uVar16 = uVar16 + 1;
                } while (bVar5);
              }
              if (1 < iVar7) {
                pdVar13 = local_f0.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar22].
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                dVar37 = *pdVar13;
                lVar21 = 3;
                lVar12 = 0x10;
                uVar16 = 1;
                do {
                  uVar19 = uVar16 + 1;
                  if ((uVar22 != 0) && ((long)uVar19 < (long)local_1d0)) {
                    dVar38 = pdVar13[uVar16];
                    uVar34 = 1;
                    pvVar28 = pvVar10;
                    do {
                      pdVar29 = (pvVar28->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl.super__Vector_impl_data._M_start;
                      dVar38 = dVar38 - *(double *)((long)pdVar29 + lVar12 + -8 + uVar34 * 8) *
                                        pdVar29[uVar34] * *pdVar29;
                      pdVar13[uVar16] = dVar38;
                      if (uVar22 <= uVar34) break;
                      lVar17 = lVar21 + uVar34;
                      uVar34 = uVar34 + 1;
                      pvVar28 = pvVar28 + -1;
                    } while (lVar17 + -1 < (long)local_1d0);
                  }
                  pdVar13[uVar16] = pdVar13[uVar16] * (1.0 / dVar37);
                  lVar21 = lVar21 + 1;
                  lVar12 = lVar12 + 8;
                  uVar16 = uVar19;
                } while (uVar19 != ((uint)local_1a0 | 1) * uVar30);
              }
              uVar22 = uVar22 + 1;
              pvVar10 = pvVar10 + 1;
            } while (uVar22 != uVar9);
          }
          if (0 < (int)uVar35) {
            pdVar13 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + -1;
            pvVar10 = local_f0.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + -1;
            uVar22 = 0;
            do {
              local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar22] =
                   local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar22];
              if (uVar22 != 0 && 1 < iVar7) {
                dVar37 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar22];
                pvVar28 = pvVar10;
                pdVar29 = pdVar13;
                uVar16 = 1;
                do {
                  dVar37 = dVar37 - (pvVar28->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data._M_start[uVar16] * *pdVar29;
                  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar22] = dVar37;
                  if ((long)local_1d0 <= (long)(uVar16 + 1)) break;
                  pdVar29 = pdVar29 + -1;
                  pvVar28 = pvVar28 + -1;
                  bVar5 = uVar16 < uVar22;
                  uVar16 = uVar16 + 1;
                } while (bVar5);
              }
              uVar22 = uVar22 + 1;
              pdVar13 = pdVar13 + 1;
              pvVar10 = pvVar10 + 1;
            } while (uVar22 != uVar9);
          }
          if (0 < (int)uVar35) {
            pdVar23 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar9;
            uVar22 = uVar9;
            do {
              uVar16 = uVar22 - 1;
              pdVar13 = local_f0.
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar16].
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar22 - 1] =
                   local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar22 - 1] / *pdVar13;
              if (1 < iVar7) {
                lVar21 = 0;
                do {
                  if ((long)uVar9 <= (long)(uVar22 + lVar21)) break;
                  local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar16] =
                       local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar16] -
                       pdVar13[lVar21 + 1] * pdVar23[lVar21];
                  lVar21 = lVar21 + 1;
                } while ((ulong)(((uint)local_1a0 + 1) * uVar30) - 1 != lVar21);
              }
              pdVar23 = pdVar23 + -1;
              bVar5 = 1 < (long)uVar22;
              uVar22 = uVar16;
            } while (bVar5);
          }
          if (0 < (int)uVar20) {
            pvVar10 = (local_108->
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            uVar9 = 0;
            iVar7 = 0;
            do {
              lVar21 = *(long *)&pvVar10[uVar9].super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data;
              if ((local_178.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar9 >> 6] >>
                   (uVar9 & 0x3f) & 1) == 0) {
                if (-1 < (int)local_110) {
                  uVar22 = 0;
                  do {
                    *(double *)(lVar21 + uVar22 * 8) = this->magic_number_;
                    uVar22 = uVar22 + 1;
                  } while (uVar30 != uVar22);
                }
              }
              else if (-1 < (int)local_110) {
                uVar22 = 0;
                do {
                  *(double *)(lVar21 + uVar22 * 8) =
                       local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)iVar7 + uVar22];
                  uVar22 = uVar22 + 1;
                } while (uVar30 != uVar22);
                iVar7 = iVar7 + (int)uVar22;
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != (uVar20 & 0x7fffffff));
          }
LAB_0011576e:
          if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::~vector(&local_f0);
          if (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::~vector
                    (&local_c0);
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::~vector(&local_a8);
          if (local_178.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p != (ulong *)0x0) {
            operator_delete(local_178.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
            return bVar36;
          }
          return bVar36;
        }
      }
    }
  }
  return false;
}

Assistant:

bool NonrecursiveMaximumLikelihoodParameterGeneration::Run(
    const std::vector<std::vector<double> >& mean_vectors,
    const std::vector<SymmetricMatrix>& covariance_matrices,
    std::vector<std::vector<double> >* smoothed_static_parameters) const {
  // Check inputs.
  if (!is_valid_ || mean_vectors.empty() ||
      mean_vectors.size() != covariance_matrices.size() ||
      NULL == smoothed_static_parameters) {
    return false;
  }

  const int num_window(static_cast<int>(window_coefficients_.size()));
  const int static_size(num_order_ + 1);
  const int length(static_size * num_window);
  if (!CheckSize(mean_vectors, length) ||
      !CheckSize(covariance_matrices, length)) {
    return false;
  }

  // Store positions that contain a magic number.
  const int sequence_length(static_cast<int>(mean_vectors.size()));
  std::vector<bool> is_continuous(sequence_length, true);
  if (use_magic_number_) {
    for (int absolute_t(0); absolute_t < sequence_length; ++absolute_t) {
      if (magic_number_ == mean_vectors[absolute_t][0]) {
        is_continuous[absolute_t] = false;
      }
    }
  }
  const int continuous_length(static_cast<int>(
      std::count(is_continuous.begin(), is_continuous.end(), true)));

  // Prepare memories.
  const int max_window_width(2 * max_half_window_width_ + 1);
  const int wuw_height(static_size * continuous_length);
  const int wuw_width(static_size * max_window_width);
  std::vector<std::vector<double> > mseq(continuous_length,
                                         std::vector<double>(length));
  std::vector<SymmetricMatrix> vseq(continuous_length, SymmetricMatrix(length));
  std::vector<double> wum(wuw_height);
  std::vector<std::vector<double> > wuw(wuw_height,
                                        std::vector<double>(wuw_width));
  std::vector<double> gg(wuw_height);
  std::vector<double> cc(wuw_height);
  {
    if (smoothed_static_parameters->size() !=
        static_cast<std::size_t>(sequence_length)) {
      smoothed_static_parameters->resize(sequence_length);
    }
    for (int t(0); t < sequence_length; ++t) {
      if ((*smoothed_static_parameters)[t].size() !=
          static_cast<std::size_t>(static_size)) {
        (*smoothed_static_parameters)[t].resize(static_size);
      }
    }
  }

  // Set mseq and vseq.
  for (int absolute_t(0), t(0); absolute_t < sequence_length; ++absolute_t) {
    if (!is_continuous[absolute_t]) continue;

    SymmetricMatrix precision;
    if (!covariance_matrices[absolute_t].Invert(&precision)) {
      return false;
    }
    const double* mean(&(mean_vectors[absolute_t][0]));

    for (int k(0); k < length; ++k) {
      // Check boundary.
      bool is_boundary(false);
      {
        const int d(k / static_size);
        const int half_window_width(
            (static_cast<int>(window_coefficients_[d].size()) - 1) / 2);
        for (int j(-half_window_width); j <= half_window_width; ++j) {
          const int biased_t(t + j);
          const int biased_absolute_t(absolute_t + j);
          const double* window_coefficients(
              &(window_coefficients_[d][half_window_width]));
          if (biased_t < 0 || continuous_length <= biased_t ||
              (0.0 != window_coefficients[j] && 0 <= biased_absolute_t &&
               biased_absolute_t < sequence_length &&
               !is_continuous[biased_absolute_t])) {
            is_boundary = true;
          }
        }
      }

      if (!is_boundary) {
        const double p(precision[k][k]);
        mseq[t][k] = p * mean[k];
        vseq[t][k][k] = p;
        for (int l(0); l < k; ++l) {
          const double q(precision[k][l]);
          if (0.0 != q) {
            mseq[t][k] += q * mean[l];
            mseq[t][l] += q * mean[k];
            vseq[t][k][l] = q;
          }
        }
      }
    }

    // Update counter.
    ++t;
  }

  // Calculate WUM and WUW.
  for (int t(0); t < continuous_length; ++t) {
    for (int m(0); m < static_size; ++m) {
      const int tau(static_size * t + m);
      for (int n(0); n < static_size; ++n) {
        for (int d(0); d < num_window; ++d) {
          const int half_window_width(
              (static_cast<int>(window_coefficients_[d].size()) - 1) / 2);
          const double* window_coefficients(
              &(window_coefficients_[d][half_window_width]));
          for (int j(-max_half_window_width_); j <= max_half_window_width_;
               ++j) {
            const int biased_t(t + j);
            if (biased_t < 0 || continuous_length <= biased_t) continue;

            // Accumulate W'U^{-1}M.
            if (0 == n &&
                CheckRange(j, half_window_width, window_coefficients, true)) {
              wum[tau] += (window_coefficients[-j] *
                           mseq[biased_t][d * static_size + m]);
            }

            // Accumulate W'U^{-1}W.
            double wu(0.0);
            for (int c(0); c < num_window; ++c) {
              const double u(
                  vseq[biased_t][static_size * c + m][static_size * d + n]);
              const int half_window_width2(
                  (static_cast<int>(window_coefficients_[c].size()) - 1) / 2);
              const double* window_coefficients2(
                  &(window_coefficients_[c][half_window_width2]));
              if (CheckRange(j, half_window_width2, window_coefficients2,
                             true) &&
                  0.0 != u) {
                wu += window_coefficients2[-j] * u;
              }
            }
            if (0.0 != wu) {
              for (int k(0); k < max_window_width && t + k < continuous_length;
                   ++k) {
                const int index(static_size * k + n - m);
                if (CheckRange(k - j, half_window_width, window_coefficients,
                               false) &&
                    0 <= index) {
                  wuw[tau][index] += wu * window_coefficients[k - j];
                }
              }
            }
          }
        }
      }
    }
  }

  // Compute Cholesky factor.
  for (int t(0); t < wuw_height; ++t) {
    for (int i(1); i < wuw_width && i <= t; ++i) {
      wuw[t][0] -= wuw[t - i][i] * wuw[t - i][i] * wuw[t - i][0];
    }

    const double z(1.0 / wuw[t][0]);
    for (int i(1); i < wuw_width; ++i) {
      for (int j(1); i + j < wuw_width && j <= t; ++j) {
        wuw[t][i] -= wuw[t - j][j] * wuw[t - j][i + j] * wuw[t - j][0];
      }
      wuw[t][i] *= z;
    }
  }

  // Forward substitution to solve a set of linear equations.
  {
    const double* r(&(wum[0]));
    double* g(&(gg[0]));
    for (int t(0); t < wuw_height; ++t) {
      g[t] = r[t];
      for (int i(1); i < wuw_width && i <= t; ++i) {
        g[t] -= wuw[t - i][i] * g[t - i];
      }
    }
  }

  // Backward substitution to solve a set of linear equations.
  {
    const double* g(&(gg[0]));
    double* c(&(cc[0]));
    for (int t(wuw_height - 1); 0 <= t; --t) {
      c[t] = g[t] / wuw[t][0];
      for (int i(1); i < wuw_width && t + i < wuw_height; ++i) {
        c[t] -= wuw[t][i] * c[t + i];
      }
    }
  }

  // Store generated parameters.
  {
    const double* c(&(cc[0]));
    int u(0);
    for (int absolute_t(0); absolute_t < sequence_length; ++absolute_t) {
      double* C(&((*smoothed_static_parameters)[absolute_t][0]));
      if (is_continuous[absolute_t]) {
        for (int k(0); k < static_size; ++k) {
          C[k] = c[u++];
        }
      } else {
        for (int k(0); k < static_size; ++k) {
          C[k] = magic_number_;
        }
      }
    }
  }

  return true;
}